

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O3

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<henson::Array>
          (Object_Data *this,Array *t,bool t_return_value)

{
  undefined8 uVar1;
  size_t sVar2;
  size_t sVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar8;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar9;
  
  puVar6 = (undefined8 *)operator_new(0x48);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_00312a08;
  uVar1 = *(undefined8 *)
           ((long)&(t->address).impl_.
                   super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                   .
                   super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                   .
                   super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>
                   .
                   super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                   .
                   super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
           + 8);
  sVar2 = t->type;
  sVar3 = t->count;
  puVar6[2] = *(undefined8 *)
               &(t->address).impl_.
                super_copy_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                .
                super_move_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                .super_assignment<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>_>.
                super_copy_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
                .
                super_move_constructor<mpark::detail::traits<void_*,_float_*,_double_*,_int_*,_long_*>,_(mpark::detail::Trait)0>
  ;
  puVar6[3] = uVar1;
  puVar6[4] = sVar2;
  puVar6[5] = sVar3;
  puVar6[6] = t->stride;
  peVar4 = (t->storage).
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (t->storage).
           super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (t->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar6[7] = peVar4;
  puVar6[8] = p_Var5;
  (t->storage).
  super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  puVar7 = (undefined8 *)operator_new(0x20);
  puVar8 = puVar6 + 2;
  puVar7[1] = &std::shared_ptr<henson::Array>::typeinfo;
  *puVar7 = &PTR__Data_Impl_003129c0;
  puVar7[2] = puVar8;
  puVar7[3] = puVar6;
  *(undefined8 *)this = 0;
  puVar6 = (undefined8 *)operator_new(0x50);
  puVar6[1] = 0x100000001;
  *puVar6 = &PTR___Sp_counted_ptr_inplace_0030d160;
  puVar6[2] = &henson::Array::typeinfo;
  puVar6[3] = &henson::Array::typeinfo;
  *(undefined4 *)(puVar6 + 4) = 0;
  puVar6[5] = puVar7;
  puVar6[6] = puVar8;
  puVar6[7] = puVar8;
  puVar6[8] = 0;
  *(undefined1 *)(puVar6 + 9) = 0;
  *(bool *)((long)puVar6 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar6;
  *(undefined8 **)this = puVar6 + 2;
  sVar9.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::Array::typeinfo;
  sVar9.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar9.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(T t, bool t_return_value)
          {
            auto p = std::make_shared<T>(std::move(t));
            auto ptr = p.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(p)),
                  false,
                  ptr,
                  t_return_value
                );
          }